

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::SetScrollHereX(float center_x_ratio)

{
  ImGuiWindow *window_00;
  float in_XMM0_Da;
  float fVar1;
  float fVar2;
  float target_pos_x;
  float spacing_x;
  ImGuiWindow *window;
  ImGuiContext *g;
  
  window_00 = GImGui->CurrentWindow;
  fVar2 = (GImGui->Style).ItemSpacing.x;
  fVar1 = ImLerp<float>((window_00->DC).LastItemRect.Min.x - fVar2,
                        (window_00->DC).LastItemRect.Max.x + fVar2,in_XMM0_Da);
  SetScrollFromPosX(window_00,fVar1 - (window_00->Pos).x,in_XMM0_Da);
  fVar2 = ImMax<float>(0.0,(window_00->WindowPadding).x - fVar2);
  (window_00->ScrollTargetEdgeSnapDist).x = fVar2;
  return;
}

Assistant:

void ImGui::SetScrollHereX(float center_x_ratio)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    float spacing_x = g.Style.ItemSpacing.x;
    float target_pos_x = ImLerp(window->DC.LastItemRect.Min.x - spacing_x, window->DC.LastItemRect.Max.x + spacing_x, center_x_ratio);
    SetScrollFromPosX(window, target_pos_x - window->Pos.x, center_x_ratio); // Convert from absolute to local pos

    // Tweak: snap on edges when aiming at an item very close to the edge
    window->ScrollTargetEdgeSnapDist.x = ImMax(0.0f, window->WindowPadding.x - spacing_x);
}